

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

SpatialMatrix * RigidBodyDynamics::Math::Xtrans_mat(Vector3d *r)

{
  CoeffReturnType m00;
  CoeffReturnType pdVar1;
  Scalar *m41;
  Scalar *m33;
  CoeffReturnType pdVar2;
  SpatialMatrix *in_RDI;
  Index in_stack_fffffffffffffcf8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_fffffffffffffd00;
  Scalar *m25;
  Scalar *m30;
  Scalar *m31;
  Scalar *m32;
  Scalar *m34;
  Scalar *m35;
  Scalar *m40;
  Scalar *m42;
  Scalar *m43;
  Scalar *m44;
  Scalar *m45;
  Scalar *m50;
  Scalar *m51;
  Scalar *m52;
  Scalar *m53;
  Scalar *m54;
  Scalar *m55;
  
  m55 = (Scalar *)0x0;
  m54 = (Scalar *)0x0;
  m53 = (Scalar *)0x0;
  m52 = (Scalar *)0x0;
  m51 = (Scalar *)0x0;
  m50 = (Scalar *)0x3ff0000000000000;
  m45 = (Scalar *)0x0;
  m44 = (Scalar *)0x0;
  m43 = (Scalar *)0x0;
  m42 = (Scalar *)0x0;
  m00 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  m41 = (Scalar *)((ulong)*pdVar1 ^ 0x8000000000000000);
  m40 = (Scalar *)0x3ff0000000000000;
  m35 = (Scalar *)0x0;
  m34 = (Scalar *)0x0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  m33 = (Scalar *)((ulong)*pdVar1 ^ 0x8000000000000000);
  m32 = (Scalar *)0x0;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  m31 = (Scalar *)0x0;
  m30 = (Scalar *)0x3ff0000000000000;
  m25 = (Scalar *)0x0;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  SpatialMatrix_t::SpatialMatrix_t
            ((SpatialMatrix_t *)&stack0xffffffffffffff20,m00,(Scalar *)&stack0xffffffffffffff28,
             (Scalar *)&stack0xffffffffffffff30,(Scalar *)&stack0xffffffffffffff38,
             (Scalar *)&stack0xffffffffffffff40,(Scalar *)&stack0xffffffffffffff10,
             (Scalar *)&stack0xffffffffffffff08,(Scalar *)&stack0xffffffffffffff00,
             (Scalar *)&stack0xfffffffffffffef8,pdVar1,(Scalar *)&stack0xfffffffffffffeb8,
             (Scalar *)in_RDI,(Scalar *)0x3ff0000000000000,(Scalar *)0x0,(Scalar *)0x0,(Scalar *)0x0
             ,(Scalar *)((ulong)*pdVar2 ^ 0x8000000000000000),m25,m30,m31,m32,m33,m34,m35,m40,m41,
             m42,m43,m44,m45,m50,m51,m52,m53,m54,m55);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI
SpatialMatrix Xtrans_mat (const Vector3d &r) {
	return SpatialMatrix (
			   1.,    0.,    0.,  0.,  0.,  0.,
			   0.,    1.,    0.,  0.,  0.,  0.,
			   0.,    0.,    1.,  0.,  0.,  0.,
			   0.,  r[2], -r[1],  1.,  0.,  0.,
			-r[2],    0.,  r[0],  0.,  1.,  0.,
			 r[1], -r[0],    0.,  0.,  0.,  1.
			);
}